

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManInvertMarks(If_DsdMan_t *p,int fVerbose)

{
  void *pvVar1;
  int i;
  
  if (p->pCellStr != (char *)0x0) {
    free(p->pCellStr);
    p->pCellStr = (char *)0x0;
  }
  for (i = 0; i < (p->vObjs).nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(&p->vObjs,i);
    *(byte *)((long)pvVar1 + 5) = *(byte *)((long)pvVar1 + 5) ^ 1;
  }
  return;
}

Assistant:

void If_DsdManInvertMarks( If_DsdMan_t * p, int fVerbose )
{
    If_DsdObj_t * pObj; 
    int i;
    ABC_FREE( p->pCellStr );
    //Vec_WrdFreeP( &p->vConfigs );
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
        pObj->fMark = !pObj->fMark;
}